

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O3

void P_ResumeConversation(void)

{
  AActor *pc;
  AActor *npc;
  undefined8 *puVar1;
  int i;
  long lVar2;
  
  puVar1 = &DAT_017e20c0;
  lVar2 = 0;
  do {
    if ((playeringame[lVar2] == true) && (pc = (AActor *)puVar1[1], pc != (AActor *)0x0)) {
      if (((pc->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        npc = (AActor *)*puVar1;
        if (npc != (AActor *)0x0) {
          if (((npc->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
            P_StartConversation(npc,pc,*(bool *)(puVar1 + 3),false);
          }
          else {
            *puVar1 = 0;
          }
        }
      }
      else {
        puVar1[1] = 0;
      }
    }
    lVar2 = lVar2 + 1;
    puVar1 = puVar1 + 0x54;
  } while (lVar2 != 8);
  return;
}

Assistant:

void P_ResumeConversation ()
{
	for (int i = 0; i < MAXPLAYERS; i++)
	{
		if (!playeringame[i])
			continue;

		player_t *p = &players[i];

		if (p->ConversationPC != NULL && p->ConversationNPC != NULL)
		{
			P_StartConversation (p->ConversationNPC, p->ConversationPC, p->ConversationFaceTalker, false);
		}
	}
}